

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O1

wchar_t validate_number_field(char *p_field,size_t i_size)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  
  cVar1 = *p_field;
  if (((cVar1 != '\0') && (cVar1 != -0x80)) && (cVar1 != -1)) {
    uVar2 = 0;
    uVar3 = uVar2;
    if (i_size != 0) {
      do {
        uVar3 = uVar2;
        if (p_field[uVar2] != ' ') break;
        uVar2 = uVar2 + 1;
        uVar3 = i_size;
      } while (i_size != uVar2);
    }
    uVar2 = uVar3;
    if (uVar3 < i_size) {
      do {
        uVar2 = uVar3;
        if ((p_field[uVar3] & 0xf8U) != 0x30) break;
        uVar3 = uVar3 + 1;
        uVar2 = i_size;
      } while (i_size != uVar3);
    }
    if (uVar2 < i_size) {
      do {
        if ((p_field[uVar2] & 0xdfU) != 0) {
          return L'\0';
        }
        uVar2 = uVar2 + 1;
      } while (i_size != uVar2);
    }
  }
  return L'\x01';
}

Assistant:

static int
validate_number_field(const char* p_field, size_t i_size)
{
	unsigned char marker = (unsigned char)p_field[0];
	if (marker == 128 || marker == 255 || marker == 0) {
		/* Base-256 marker, there's nothing we can check. */
		return 1;
	} else {
		/* Must be octal */
		size_t i = 0;
		/* Skip any leading spaces */
		while (i < i_size && p_field[i] == ' ') {
			++i;
		}
		/* Skip octal digits. */
		while (i < i_size && p_field[i] >= '0' && p_field[i] <= '7') {
			++i;
		}
		/* Any remaining characters must be space or NUL padding. */
		while (i < i_size) {
			if (p_field[i] != ' ' && p_field[i] != 0) {
				return 0;
			}
			++i;
		}
		return 1;
	}
}